

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

bool tcu::boolAny<4>(Vector<bool,_4> *a)

{
  int local_1c;
  int i;
  Vector<bool,_4> *a_local;
  
  local_1c = 0;
  while( true ) {
    if (3 < local_1c) {
      return false;
    }
    if ((a->m_data[local_1c] & 1U) == 1) break;
    local_1c = local_1c + 1;
  }
  return true;
}

Assistant:

inline bool boolAny (const Vector<bool, Size>& a)
{
	for (int i = 0; i < Size; i++)
		if (a.m_data[i] == true)
			return true;
	return false;
}